

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approx_top_k.cpp
# Opt level: O2

AggregateFunction * duckdb::ApproxTopKFun::GetFunction(void)

{
  AggregateFunction *in_RDI;
  long lVar1;
  initializer_list<duckdb::LogicalType> __l;
  allocator_type local_aa;
  allocator local_a9;
  LogicalType local_a8;
  LogicalType local_90;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_78;
  LogicalType local_60 [2];
  string local_30;
  
  ::std::__cxx11::string::string((string *)&local_30,"approx_top_k",&local_a9);
  LogicalType::LogicalType(local_60,ANY);
  LogicalType::LogicalType(local_60 + 1,BIGINT);
  __l._M_len = 2;
  __l._M_array = local_60;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_78,__l,&local_aa);
  LogicalType::LogicalType(&local_a8,ANY);
  LogicalType::LIST(&local_90,&local_a8);
  AggregateFunction::AggregateFunction
            (in_RDI,&local_30,(vector<duckdb::LogicalType,_true> *)&local_78,&local_90,
             AggregateFunction::StateSize<duckdb::ApproxTopKState>,
             AggregateFunction::
             StateInitialize<duckdb::ApproxTopKState,duckdb::ApproxTopKOperation,(duckdb::AggregateDestructorType)0>
             ,ApproxTopKUpdate<duckdb::string_t,duckdb::HistogramGenericFunctor>,
             AggregateFunction::StateCombine<duckdb::ApproxTopKState,duckdb::ApproxTopKOperation>,
             ApproxTopKFinalize<duckdb::HistogramGenericFunctor>,(aggregate_simple_update_t)0x0,
             ApproxTopKBind,
             AggregateFunction::StateDestroy<duckdb::ApproxTopKState,duckdb::ApproxTopKOperation>,
             (aggregate_statistics_t)0x0,(aggregate_window_t)0x0,(aggregate_serialize_t)0x0,
             (aggregate_deserialize_t)0x0);
  LogicalType::~LogicalType(&local_90);
  LogicalType::~LogicalType(&local_a8);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_78);
  lVar1 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_60[0].id_ + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  ::std::__cxx11::string::~string((string *)&local_30);
  return in_RDI;
}

Assistant:

AggregateFunction ApproxTopKFun::GetFunction() {
	using STATE = ApproxTopKState;
	using OP = ApproxTopKOperation;
	return AggregateFunction("approx_top_k", {LogicalTypeId::ANY, LogicalType::BIGINT},
	                         LogicalType::LIST(LogicalType::ANY), AggregateFunction::StateSize<STATE>,
	                         AggregateFunction::StateInitialize<STATE, OP>, ApproxTopKUpdate,
	                         AggregateFunction::StateCombine<STATE, OP>, ApproxTopKFinalize, nullptr, ApproxTopKBind,
	                         AggregateFunction::StateDestroy<STATE, OP>);
}